

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O1

void __thiscall kj::anon_unknown_0::TestCase326::run(TestCase326 *this)

{
  PromiseNode *pPVar1;
  long *plVar2;
  char cVar3;
  byte bVar4;
  PromiseFulfillerPair<void> pair;
  WaitScope waitScope;
  EventLoop loop;
  Own<kj::_::PromiseNode> local_1d8;
  undefined8 *local_1c8;
  long *local_1c0;
  WaitScope local_1b8;
  EventLoop local_1a8;
  ExceptionOrValue local_170;
  char local_10;
  
  EventLoop::EventLoop(&local_1a8);
  local_1b8.busyPollInterval = 0xffffffff;
  local_1b8.loop = &local_1a8;
  EventLoop::enterScope(&local_1a8);
  newPromiseAndFulfiller<void>();
  cVar3 = (**(code **)(*local_1c0 + 0x10))();
  if (cVar3 == '\0' && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[45]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++"
               ,0x14c,ERROR,"\"failed: expected \" \"pair.fulfiller->isWaiting()\"",
               (char (*) [45])"failed: expected pair.fulfiller->isWaiting()");
  }
  (**(code **)*local_1c0)(local_1c0,&local_170);
  bVar4 = (**(code **)(*local_1c0 + 0x10))();
  if ((bVar4 & _::Debug::minSeverity < 3) != 0) {
    _::Debug::log<char_const(&)[48]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++"
               ,0x14e,ERROR,"\"failed: expected \" \"!(pair.fulfiller->isWaiting())\"",
               (char (*) [48])"failed: expected !(pair.fulfiller->isWaiting())");
  }
  local_170.exception.ptr.isSet = false;
  local_10 = '\0';
  _::waitImpl(&local_1d8,&local_170,&local_1b8);
  if (local_10 == '\x01') {
    if (local_170.exception.ptr.isSet != false) {
      throwRecoverableException(&local_170.exception.ptr.field_1.value,0);
    }
  }
  else {
    if (local_170.exception.ptr.isSet == false) {
      _::unreachable();
    }
    throwRecoverableException(&local_170.exception.ptr.field_1.value,0);
  }
  if (local_170.exception.ptr.isSet == true) {
    Exception::~Exception(&local_170.exception.ptr.field_1.value);
  }
  plVar2 = local_1c0;
  if (local_1c0 != (long *)0x0) {
    local_1c0 = (long *)0x0;
    (**(code **)*local_1c8)(local_1c8,(long)plVar2 + *(long *)(*plVar2 + -0x10));
  }
  pPVar1 = local_1d8.ptr;
  if (local_1d8.ptr != (PromiseNode *)0x0) {
    local_1d8.ptr = (PromiseNode *)0x0;
    (**(local_1d8.disposer)->_vptr_Disposer)
              (local_1d8.disposer,pPVar1->_vptr_PromiseNode[-2] + (long)&pPVar1->_vptr_PromiseNode);
  }
  EventLoop::leaveScope(local_1b8.loop);
  EventLoop::~EventLoop(&local_1a8);
  return;
}

Assistant:

TEST(Async, SeparateFulfillerVoid) {
  EventLoop loop;
  WaitScope waitScope(loop);

  auto pair = newPromiseAndFulfiller<void>();

  EXPECT_TRUE(pair.fulfiller->isWaiting());
  pair.fulfiller->fulfill();
  EXPECT_FALSE(pair.fulfiller->isWaiting());

  pair.promise.wait(waitScope);
}